

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseResolveThenableTaskFunction::MarshalToScriptContext
          (JavascriptPromiseResolveThenableTaskFunction *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
      scriptContext.ptr == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptPromise.h"
                                ,0x4b,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00ba16dc;
    *puVar3 = 0;
  }
  if ((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::JavascriptPromiseResolveThenableTaskFunction>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptPromise.h"
                                ,0x4b,
                                "(VirtualTableInfo<JavascriptPromiseResolveThenableTaskFunction>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00ba16dc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)
       VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseResolveThenableTaskFunction>_>::
       Address;
  return;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
            : RuntimeFunction(type, functionInfo), promise(promise), thenable(thenable), thenFunction(thenFunction)
        { }